

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  ushort uVar1;
  sqlite3 *psVar2;
  Mem *pMVar3;
  uint uVar4;
  char cVar5;
  uchar uVar6;
  int nName;
  int iVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uchar *puVar11;
  ulong uVar12;
  int iVar13;
  long in_FS_OFFSET;
  MemValue local_a8;
  undefined1 *puStack_a0;
  undefined1 *puStack_98;
  sqlite3 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  sqlite3_str local_68;
  int idx;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  idx = 0;
  local_a8.i = -1;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  psVar2 = p->db;
  local_68.mxAlloc = psVar2->aLimit[0];
  local_68.db = (sqlite3 *)0x0;
  local_68.zText = (char *)0x0;
  local_68.nAlloc = 0;
  local_68.nChar = 0;
  local_68.accError = '\0';
  local_68.printfFlags = '\0';
  local_68._30_2_ = 0xaaaa;
  if (psVar2->nVdbeExec < 2) {
    if (p->nVar == 0) {
      iVar7 = sqlite3Strlen30(zRawSql);
      sqlite3_str_append(&local_68,zRawSql,iVar7);
    }
    else {
      iVar7 = 1;
      while (*zRawSql != '\0') {
        local_3c = -0x55555556;
        uVar6 = '\x01';
        iVar13 = 0;
        puVar11 = (uchar *)zRawSql;
        while ((nName = 0, uVar6 != '\0' &&
               (nName = sqlite3GetToken(puVar11,&local_3c), local_3c != 0x9d))) {
          iVar13 = iVar13 + nName;
          uVar6 = puVar11[nName];
          puVar11 = puVar11 + nName;
        }
        sqlite3_str_append(&local_68,zRawSql,iVar13);
        if (nName == 0) break;
        puVar11 = (uchar *)zRawSql + iVar13;
        if (*puVar11 == '?') {
          iVar13 = iVar7;
          if (1 < nName) {
            sqlite3GetInt32((char *)(puVar11 + 1),&idx);
            iVar13 = idx;
          }
        }
        else {
          iVar13 = sqlite3VdbeParameterIndex(p,(char *)puVar11,nName);
        }
        idx = iVar13;
        zRawSql = (char *)(puVar11 + nName);
        if (iVar7 < idx + 1) {
          iVar7 = idx + 1;
        }
        pMVar3 = p->aVar;
        lVar8 = (long)idx;
        uVar1 = pMVar3[lVar8 + -1].flags;
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 0x24) == 0) {
            if ((uVar1 & 8) == 0) {
              if ((uVar1 & 2) == 0) {
                if ((uVar1 >> 10 & 1) == 0) {
                  sqlite3_str_append(&local_68,"x\'",2);
                  uVar4 = pMVar3[lVar8 + -1].n;
                  if (pMVar3[lVar8 + -1].n < 1) {
                    uVar4 = 0;
                  }
                  for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                    sqlite3_str_appendf(&local_68,"%02x",(ulong)(byte)pMVar3[lVar8 + -1].z[uVar12]);
                  }
                  sqlite3_str_append(&local_68,"\'",1);
                }
                else {
                  sqlite3_str_appendf(&local_68,"zeroblob(%d)",
                                      (ulong)(uint)pMVar3[lVar8 + -1].u.nZero);
                }
              }
              else if (psVar2->enc == '\x01') {
                sqlite3_str_appendf(&local_68,"\'%.*q\'",(ulong)(uint)pMVar3[lVar8 + -1].n,
                                    pMVar3[lVar8 + -1].z);
              }
              else {
                puStack_98 = (undefined1 *)0x0;
                puStack_88 = (undefined1 *)0x0;
                local_80 = (undefined1 *)0x0;
                puStack_78 = (undefined1 *)0x0;
                local_a8.r = 0.0;
                puStack_a0 = (undefined1 *)0x0;
                local_90 = psVar2;
                sqlite3VdbeMemSetStr
                          ((Mem *)&local_a8,pMVar3[lVar8 + -1].z,(long)pMVar3[lVar8 + -1].n,
                           psVar2->enc,(_func_void_void_ptr *)0x0);
                iVar13 = sqlite3VdbeChangeEncoding((Mem *)&local_a8,1);
                if (iVar13 == 7) {
                  local_68.accError = '\a';
                  local_68.nAlloc = 0;
                }
                sqlite3_str_appendf(&local_68,"\'%.*q\'",(ulong)puStack_98 & 0xffffffff,puStack_a0);
                sqlite3VdbeMemRelease((Mem *)&local_a8);
              }
            }
            else {
              sqlite3_str_appendf(&local_68,"%!.15g",pMVar3[lVar8 + -1].u.nZero);
            }
          }
          else {
            sqlite3_str_appendf(&local_68,"%lld",pMVar3[lVar8 + -1].u.r);
          }
        }
        else {
          sqlite3_str_append(&local_68,"NULL",4);
        }
      }
    }
  }
  else {
    for (; cVar5 = *zRawSql, lVar8 = 1, cVar5 != '\0'; zRawSql = zRawSql + lVar10) {
      do {
        lVar10 = lVar8;
        if (cVar5 == '\n') break;
        cVar5 = zRawSql[lVar10];
        lVar8 = lVar10 + 1;
      } while (cVar5 != '\0');
      sqlite3_str_append(&local_68,"-- ",3);
      sqlite3_str_append(&local_68,zRawSql,(int)lVar10);
    }
  }
  if (local_68.accError != '\0') {
    sqlite3_str_reset(&local_68);
  }
  pcVar9 = sqlite3StrAccumFinish(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pcVar9;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}